

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O3

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::calculateOverlappingPairs
          (cbtAxisSweep3Internal<unsigned_short> *this,cbtDispatcher *dispatcher)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  cbtBroadphasePair *pcVar4;
  cbtBroadphaseProxy *pcVar5;
  cbtBroadphaseProxy *pcVar6;
  undefined8 uVar7;
  cbtAxisSweep3Internal<unsigned_short> *pcVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  cbtAlignedObjectArray<cbtBroadphasePair> *this_00;
  cbtBroadphasePair *pcVar12;
  long lVar13;
  ulong uVar14;
  Handle *pHandleB;
  cbtBroadphaseProxy *pcVar15;
  Handle *pHandleA;
  cbtBroadphaseProxy *pcVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  int curSize;
  uint uVar20;
  cbtBroadphasePairSortPredicate local_42;
  cbtBroadphasePairSortPredicate local_41;
  cbtAxisSweep3Internal<unsigned_short> *local_40;
  cbtDispatcher *local_38;
  undefined4 extraout_var;
  
  local_38 = dispatcher;
  iVar10 = (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback
             [0xf])();
  if ((char)iVar10 != '\0') {
    iVar10 = (*(this->m_pairCache->super_cbtOverlappingPairCallback).
               _vptr_cbtOverlappingPairCallback[7])();
    this_00 = (cbtAlignedObjectArray<cbtBroadphasePair> *)CONCAT44(extraout_var,iVar10);
    uVar20 = this_00->m_size;
    if (1 < (int)uVar20) {
      cbtAlignedObjectArray<cbtBroadphasePair>::quickSortInternal<cbtBroadphasePairSortPredicate>
                (this_00,&local_41,0,uVar20 - 1);
      uVar20 = this_00->m_size;
    }
    lVar18 = (long)this->m_invalidPair;
    iVar10 = uVar20 - this->m_invalidPair;
    if (lVar18 < 0) {
      if (this_00->m_capacity < iVar10) {
        if (iVar10 == 0) {
          pcVar12 = (cbtBroadphasePair *)0x0;
          uVar11 = uVar20;
        }
        else {
          pcVar12 = (cbtBroadphasePair *)cbtAlignedAllocInternal((long)iVar10 << 5,0x10);
          uVar11 = this_00->m_size;
        }
        if (0 < (int)uVar11) {
          lVar13 = 0;
          do {
            pcVar4 = this_00->m_data;
            puVar1 = (undefined8 *)((long)&pcVar4->m_pProxy0 + lVar13);
            uVar7 = puVar1[1];
            puVar2 = (undefined8 *)((long)&pcVar12->m_pProxy0 + lVar13);
            *puVar2 = *puVar1;
            puVar2[1] = uVar7;
            *(undefined8 *)((long)&pcVar12->m_algorithm + lVar13) =
                 *(undefined8 *)((long)&pcVar4->m_algorithm + lVar13);
            *(undefined8 *)((long)&pcVar12->field_3 + lVar13) =
                 *(undefined8 *)((long)&pcVar4->field_3 + lVar13);
            lVar13 = lVar13 + 0x20;
          } while ((ulong)uVar11 << 5 != lVar13);
        }
        if ((this_00->m_data != (cbtBroadphasePair *)0x0) && (this_00->m_ownsMemory == true)) {
          cbtAlignedFreeInternal(this_00->m_data);
        }
        this_00->m_ownsMemory = true;
        this_00->m_data = pcVar12;
        this_00->m_capacity = iVar10;
      }
      lVar13 = (long)(int)uVar20 << 5;
      do {
        *(undefined1 (*) [32])((long)&this_00->m_data->m_pProxy0 + lVar13) =
             ZEXT1632(ZEXT816(0) << 0x40);
        lVar13 = lVar13 + 0x20;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0);
    }
    this_00->m_size = iVar10;
    this->m_invalidPair = 0;
    if (0 < iVar10) {
      iVar17 = 0;
      lVar18 = 0;
      pcVar15 = (cbtBroadphaseProxy *)0x0;
      pcVar16 = (cbtBroadphaseProxy *)0x0;
      local_40 = this;
      do {
        pcVar8 = local_40;
        pcVar12 = this_00->m_data;
        pcVar5 = pcVar12[lVar18].m_pProxy0;
        pcVar6 = pcVar12[lVar18].m_pProxy1;
        if (((pcVar15 == pcVar6 && pcVar16 == pcVar5) ||
            (*(ushort *)((long)&pcVar5[1].m_clientObject + 2) < *(ushort *)&pcVar6->field_0x34)) ||
           (*(ushort *)((long)&pcVar6[1].m_clientObject + 2) < *(ushort *)&pcVar5->field_0x34)) {
LAB_0089eb2e:
          pcVar12 = pcVar12 + lVar18;
          (*(local_40->m_pairCache->super_cbtOverlappingPairCallback).
            _vptr_cbtOverlappingPairCallback[8])(local_40->m_pairCache,pcVar12,local_38);
          pcVar12->m_pProxy0 = (cbtBroadphaseProxy *)SUB168(ZEXT816(0) << 0x40,0);
          pcVar12->m_pProxy1 = (cbtBroadphaseProxy *)SUB168(ZEXT816(0) << 0x40,8);
          iVar17 = pcVar8->m_invalidPair + 1;
          pcVar8->m_invalidPair = iVar17;
          iVar10 = this_00->m_size;
        }
        else {
          uVar9 = 0;
          do {
            uVar14 = uVar9;
            if ((uVar14 == 2) ||
               (*(ushort *)((long)(&pcVar5[1].m_aabbMin + -1) + uVar14 * 2) <
                *(ushort *)((long)(&pcVar6->m_aabbMax + 1) + uVar14 * 2 + 2))) break;
            uVar9 = uVar14 + 1;
          } while (*(ushort *)((long)(&pcVar5->m_aabbMax + 1) + uVar14 * 2 + 2) <=
                   *(ushort *)((long)(&pcVar6[1].m_aabbMin + -1) + uVar14 * 2));
          if (uVar14 < 2) goto LAB_0089eb2e;
        }
        lVar18 = lVar18 + 1;
        pcVar15 = pcVar6;
        pcVar16 = pcVar5;
      } while (lVar18 < iVar10);
      iVar19 = iVar10;
      if (1 < iVar10) {
        cbtAlignedObjectArray<cbtBroadphasePair>::quickSortInternal<cbtBroadphasePairSortPredicate>
                  (this_00,&local_42,0,iVar10 + -1);
        iVar17 = local_40->m_invalidPair;
        iVar19 = this_00->m_size;
      }
      this = local_40;
      iVar10 = iVar19 - iVar17;
      if (iVar17 < 0) {
        if (this_00->m_capacity < iVar10) {
          if (iVar19 == iVar17) {
            pcVar12 = (cbtBroadphasePair *)0x0;
          }
          else {
            pcVar12 = (cbtBroadphasePair *)cbtAlignedAllocInternal((long)iVar10 << 5,0x10);
            iVar3 = this_00->m_size;
            if (0 < (long)iVar3) {
              lVar18 = 0;
              do {
                pcVar4 = this_00->m_data;
                puVar1 = (undefined8 *)((long)&pcVar4->m_pProxy0 + lVar18);
                uVar7 = puVar1[1];
                puVar2 = (undefined8 *)((long)&pcVar12->m_pProxy0 + lVar18);
                *puVar2 = *puVar1;
                puVar2[1] = uVar7;
                *(undefined8 *)((long)&pcVar12->m_algorithm + lVar18) =
                     *(undefined8 *)((long)&pcVar4->m_algorithm + lVar18);
                *(undefined8 *)((long)&pcVar12->field_3 + lVar18) =
                     *(undefined8 *)((long)&pcVar4->field_3 + lVar18);
                lVar18 = lVar18 + 0x20;
              } while ((long)iVar3 * 0x20 != lVar18);
            }
          }
          if ((this_00->m_data != (cbtBroadphasePair *)0x0) && (this_00->m_ownsMemory == true)) {
            cbtAlignedFreeInternal(this_00->m_data);
          }
          this_00->m_ownsMemory = true;
          this_00->m_data = pcVar12;
          this_00->m_capacity = iVar10;
        }
        lVar13 = (long)iVar17;
        lVar18 = (long)iVar19 << 5;
        do {
          puVar1 = (undefined8 *)((long)&this_00->m_data->m_pProxy0 + lVar18);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1[2] = 0;
          puVar1[3] = 0;
          lVar18 = lVar18 + 0x20;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0);
      }
    }
    this_00->m_size = iVar10;
    this->m_invalidPair = 0;
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::calculateOverlappingPairs(cbtDispatcher* dispatcher)
{
	if (m_pairCache->hasDeferredRemoval())
	{
		cbtBroadphasePairArray& overlappingPairArray = m_pairCache->getOverlappingPairArray();

		//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(cbtBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;

		int i;

		cbtBroadphasePair previousPair;
		previousPair.m_pProxy0 = 0;
		previousPair.m_pProxy1 = 0;
		previousPair.m_algorithm = 0;

		for (i = 0; i < overlappingPairArray.size(); i++)
		{
			cbtBroadphasePair& pair = overlappingPairArray[i];

			bool isDuplicate = (pair == previousPair);

			previousPair = pair;

			bool needsRemoval = false;

			if (!isDuplicate)
			{
				///important to use an AABB test that is consistent with the broadphase
				bool hasOverlap = testAabbOverlap(pair.m_pProxy0, pair.m_pProxy1);

				if (hasOverlap)
				{
					needsRemoval = false;  //callback->processOverlap(pair);
				}
				else
				{
					needsRemoval = true;
				}
			}
			else
			{
				//remove duplicate
				needsRemoval = true;
				//should have no algorithm
				cbtAssert(!pair.m_algorithm);
			}

			if (needsRemoval)
			{
				m_pairCache->cleanOverlappingPair(pair, dispatcher);

				//		m_overlappingPairArray.swap(i,m_overlappingPairArray.size()-1);
				//		m_overlappingPairArray.pop_back();
				pair.m_pProxy0 = 0;
				pair.m_pProxy1 = 0;
				m_invalidPair++;
			}
		}

///if you don't like to skip the invalid pairs in the array, execute following code:
#define CLEAN_INVALID_PAIRS 1
#ifdef CLEAN_INVALID_PAIRS

		//perform a sort, to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(cbtBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;
#endif  //CLEAN_INVALID_PAIRS

		//printf("overlappingPairArray.size()=%d\n",overlappingPairArray.size());
	}
}